

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int should_send_max_streams(quicly_conn_t *conn,int uni)

{
  bool bVar1;
  int iVar2;
  
  if ((&(((conn->super).ctx)->transport_params).max_streams_bidi)[uni != 0] != 0) {
    bVar1 = uni != 0;
    iVar2 = quicly_maxsender_should_send_max
                      ((quicly_maxsender_t *)
                       ((conn->egress).loss.largest_acked_packet_plus1 +
                       (ulong)(uni == 0) * 4 + -0xe),
                       (&(conn->super).remote.bidi)[bVar1].next_stream_id / 4,
                       (&(conn->super).remote.bidi)[bVar1].num_streams,0x300);
    return iVar2;
  }
  return 0;
}

Assistant:

static int should_send_max_streams(quicly_conn_t *conn, int uni)
{
    uint64_t concurrency;
    quicly_maxsender_t *maxsender;
    struct st_quicly_conn_streamgroup_state_t *group;

#define INIT_VARS(type)                                                                                                            \
    do {                                                                                                                           \
        concurrency = conn->super.ctx->transport_params.max_streams_##type;                                                        \
        maxsender = &conn->ingress.max_streams.type;                                                                               \
        group = &conn->super.remote.type;                                                                                          \
    } while (0)
    if (uni) {
        INIT_VARS(uni);
    } else {
        INIT_VARS(bidi);
    }
#undef INIT_VARS

    if (concurrency == 0)
        return 0;

    if (!quicly_maxsender_should_send_max(maxsender, group->next_stream_id / 4, group->num_streams, 768))
        return 0;

    return 1;
}